

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoPrintClasses(Gia_IsoMan_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int nSize;
  int iBegin;
  int k;
  int i;
  int fVerbose;
  Gia_IsoMan_t *p_local;
  
  iVar1 = Vec_IntSize(p->vClasses);
  printf("The total of %d classes:\n",(long)iVar1 / 2 & 0xffffffff,(long)iVar1 % 2 & 0xffffffff);
  for (iBegin = 0; iVar1 = Vec_IntSize(p->vClasses), iBegin + 1 < iVar1; iBegin = iBegin + 2) {
    uVar2 = Vec_IntEntry(p->vClasses,iBegin);
    uVar3 = Vec_IntEntry(p->vClasses,iBegin + 1);
    printf("%5d : (%3d,%3d)  ",(long)iBegin / 2 & 0xffffffff,(ulong)uVar2,(ulong)uVar3);
    printf("\n");
  }
  return;
}

Assistant:

void Gia_IsoPrintClasses( Gia_IsoMan_t * p )
{
    int fVerbose = 0;
    int i, k, iBegin, nSize;
    printf( "The total of %d classes:\n", Vec_IntSize(p->vClasses)/2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        printf( "%5d : (%3d,%3d)  ", i/2, iBegin, nSize );
        if ( fVerbose )
        {
            printf( "{" );
            for ( k = 0; k < nSize; k++ )
                printf( " %3d,%08x", Gia_IsoGetItem(p, iBegin+k), Gia_IsoGetValue(p, iBegin+k) );
            printf( " }" );
        }
        printf( "\n" );
    }
}